

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1cmap.c
# Opt level: O1

FT_Error t1_cmap_custom_init(T1_CMapCustom cmap,FT_Pointer pointer)

{
  FT_UInt FVar1;
  FT_Face pFVar2;
  
  pFVar2 = (cmap->cmap).charmap.face;
  FVar1 = *(FT_UInt *)&pFVar2[2].field_0x3c;
  cmap->first = FVar1;
  cmap->count = *(int *)&pFVar2[2].available_sizes - FVar1;
  cmap->indices = *(FT_UShort **)&pFVar2[2].num_charmaps;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  t1_cmap_custom_init( T1_CMapCustom  cmap,
                       FT_Pointer     pointer )
  {
    T1_Face      face     = (T1_Face)FT_CMAP_FACE( cmap );
    T1_Encoding  encoding = &face->type1.encoding;

    FT_UNUSED( pointer );


    cmap->first   = (FT_UInt)encoding->code_first;
    cmap->count   = (FT_UInt)encoding->code_last - cmap->first;
    cmap->indices = encoding->char_index;

    FT_ASSERT( cmap->indices );
    FT_ASSERT( encoding->code_first <= encoding->code_last );

    return 0;
  }